

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

void RunBenchmark<double>(TBenchmarkOpts *opts)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ulong uVar3;
  size_type __new_size;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  runtime_error *this;
  double *pdVar7;
  pointer pcVar8;
  uint uVar9;
  unsigned_long uVar10;
  double *pdVar11;
  size_t sVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  double dVar16;
  undefined4 uVar17;
  undefined4 uVar22;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  vector<double_*,_std::allocator<double_*>_> outVectors;
  vector<double_*,_std::allocator<double_*>_> inVectors;
  string func;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  outData;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  inData;
  mt19937_64 rng;
  string local_ad0;
  size_t local_ab0;
  vector<double_*,_std::allocator<double_*>_> local_aa8;
  vector<double_*,_std::allocator<double_*>_> local_a90;
  int local_a78;
  int local_a74;
  int local_a70;
  int local_a6c;
  size_t local_a68;
  size_t local_a60;
  size_type local_a58;
  size_t local_a50;
  long *local_a48 [2];
  long local_a38 [2];
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  local_a28;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  local_a10;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9f8;
  
  local_a48[0] = local_a38;
  pcVar2 = (opts->Func)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a48,pcVar2,pcVar2 + (opts->Func)._M_string_length);
  local_a60 = opts->NVectors;
  local_a68 = opts->NIter;
  local_ab0 = opts->VecSize;
  uVar3 = opts->Alignment;
  local_a6c = std::__cxx11::string::compare((char *)local_a48);
  bVar13 = local_a6c != 0;
  local_a70 = std::__cxx11::string::compare((char *)local_a48);
  bVar14 = local_a70 != 0;
  local_a74 = std::__cxx11::string::compare((char *)local_a48);
  bVar15 = local_a74 != 0;
  local_a78 = std::__cxx11::string::compare((char *)local_a48);
  if ((local_a78 != 0 && bVar15) && (bVar14 && bVar13)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"requirement isExp || isLog || isSigm || isTanh failed",0x35);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_0010e92c:
    exit(1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Preparing data. Vector size: ",0x1d);
  sVar12 = local_a60;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tnumber of vectors: ",0x14);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tnumber of tries: ",0x12);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  local_9f8._M_x[0] = 0xf;
  lVar6 = 1;
  uVar10 = 0xf;
  do {
    uVar10 = (uVar10 >> 0x3e ^ uVar10) * 0x5851f42d4c957f2d + lVar6;
    local_9f8._M_x[lVar6] = uVar10;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x138);
  local_9f8._M_p = 0x138;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(&local_a10,sVar12,(allocator_type *)&local_ad0);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(&local_a28,sVar12,(allocator_type *)&local_ad0);
  if (0x1f < uVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"requirement alignment < 32 failed",0x21);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    goto LAB_0010e92c;
  }
  if ((uVar3 & 7) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "requirement on natural alignment failed: alignment should be multiple of ",0x49);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::endl<char,std::char_traits<char>>(poVar5);
    goto LAB_0010e92c;
  }
  std::vector<double_*,_std::allocator<double_*>_>::vector
            (&local_a90,sVar12,(allocator_type *)&local_ad0);
  std::vector<double_*,_std::allocator<double_*>_>::vector
            (&local_aa8,sVar12,(allocator_type *)&local_ad0);
  if (sVar12 != 0) {
    bVar13 = local_a78 == 0;
    bVar14 = local_a74 == 0;
    local_a58 = local_ab0 * 8 + 0x20;
    sVar12 = 0;
    do {
      __new_size = local_a58;
      local_a50 = sVar12;
      std::vector<char,_std::allocator<char>_>::resize
                (local_a10.
                 super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + sVar12,local_a58);
      std::vector<char,_std::allocator<char>_>::resize
                (local_a28.
                 super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + sVar12,__new_size);
      sVar4 = local_a50;
      pdVar7 = (double *)
               local_a10.
               super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar12].
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start;
      do {
        pdVar11 = pdVar7;
        pdVar7 = (double *)((long)pdVar11 + 1);
      } while (((uint)pdVar11 & 0x1f) != uVar3);
      pcVar8 = local_a28.
               super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar12].
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar7 = (double *)(pcVar8 + -1);
      do {
        uVar9 = (uint)pcVar8;
        pdVar7 = (double *)((long)pdVar7 + 1);
        pcVar8 = pcVar8 + 1;
      } while ((uVar9 & 0x1f) != uVar3);
      local_a90.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
      super__Vector_impl_data._M_start[local_a50] = pdVar11;
      local_aa8.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
      super__Vector_impl_data._M_start[local_a50] = pdVar7;
      if (local_ab0 != 0) {
        sVar12 = 0;
        do {
          dVar16 = std::
                   generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                             (&local_9f8);
          dVar16 = (dVar16 + 0.0) * 100.0 + -50.0;
          pdVar11[sVar12] = dVar16;
          if (local_a70 == 0) {
            dVar16 = exp(dVar16);
LAB_0010dd40:
            pdVar11[sVar12] = dVar16;
          }
          else if (bVar14 || bVar13) {
            dVar16 = dVar16 / 10.0;
            goto LAB_0010dd40;
          }
          sVar12 = sVar12 + 1;
        } while (local_ab0 != sVar12);
      }
      sVar12 = sVar4 + 1;
    } while (sVar12 != local_a60);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Running",7);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  sVar12 = local_a68;
  uVar22 = (undefined4)(local_a68 >> 0x20);
  uVar17 = (undefined4)local_a68;
  if (local_a6c == 0) {
    paVar1 = &local_ad0.field_2;
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"slow exp","");
    BenchmarkFunc<TSlowExp,double>(&local_a90,&local_aa8,local_ab0,1,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"plain fast exp","");
    auVar19._8_4_ = uVar22;
    auVar19._0_8_ = sVar12;
    auVar19._12_4_ = 0x45300000;
    dVar16 = round(((auVar19._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,uVar17) - 4503599627370496.0)) * 0.5);
    BenchmarkFunc<TPlainExp,double>(&local_a90,&local_aa8,local_ab0,(long)(int)dVar16,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    if ((uVar3 & 8) == 0 && (local_ab0 & 3) == 0) {
      local_ad0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"fmath exp","");
      BenchmarkFunc<TFmathExp,double>(&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ad0._M_dataplus._M_p != paVar1) {
        operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
      }
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"avx fast exp","");
    BenchmarkFunc<TAvxExp<false>,double>(&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"avx fast exact exp","");
    BenchmarkFunc<TAvxExp<true>,double>(&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"dispatched fast exp","");
    BenchmarkFunc<TDispatchedAvx2Exp<false>,double>
              (&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    if (NFastOps::HaveAvx2()::haveAVX2 == '\0') {
      RunBenchmark<double>();
    }
    if (NFastOps::HaveAvx2()::haveAVX2 != '\x01') goto LAB_0010e830;
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"avx2 fast exp","");
    BenchmarkFunc<TAvx2Exp<false>,double>(&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"avx2 fast exact exp","");
    BenchmarkFunc<TAvx2Exp<true>,double>(&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
  }
  else if (local_a70 == 0) {
    paVar1 = &local_ad0.field_2;
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"slow log","");
    BenchmarkFunc<TSlowLog,double>(&local_a90,&local_aa8,local_ab0,1,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"plain fast log","");
    auVar20._8_4_ = uVar22;
    auVar20._0_8_ = sVar12;
    auVar20._12_4_ = 0x45300000;
    dVar16 = round(((auVar20._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,uVar17) - 4503599627370496.0)) * 0.5);
    BenchmarkFunc<TPlainLog,double>(&local_a90,&local_aa8,local_ab0,(long)(int)dVar16,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    if ((local_ab0 & 3) == 0) {
      local_ad0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"fmath log","");
      BenchmarkFunc<TFmathLog,double>(&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ad0._M_dataplus._M_p != paVar1) {
        operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
      }
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"avx fast log","");
    BenchmarkFunc<TAvxLog<false>,double>(&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"dispatched fast log","");
    BenchmarkFunc<TDispatchedAvx2Log<false>,double>
              (&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"avx fast exact log","");
    BenchmarkFunc<TAvxLog<true>,double>(&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    if (NFastOps::HaveAvx2()::haveAVX2 == '\0') {
      RunBenchmark<double>();
    }
    if (NFastOps::HaveAvx2()::haveAVX2 != '\x01') goto LAB_0010e830;
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"avx2 fast log","");
    BenchmarkFunc<TAvx2Log<false>,double>(&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"avx2 fast exact log","");
    BenchmarkFunc<TAvx2Log<true>,double>(&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
  }
  else if (local_a74 == 0) {
    paVar1 = &local_ad0.field_2;
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"slow sigmoid","");
    BenchmarkFunc<TSlowSigm,double>(&local_a90,&local_aa8,local_ab0,1,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"plain fast sigmoid","");
    auVar21._8_4_ = uVar22;
    auVar21._0_8_ = sVar12;
    auVar21._12_4_ = 0x45300000;
    dVar16 = round(((auVar21._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,uVar17) - 4503599627370496.0)) * 0.5);
    BenchmarkFunc<TPlainSigm,double>(&local_a90,&local_aa8,local_ab0,(long)(int)dVar16,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"avx fast sigmoid","");
    BenchmarkFunc<TAvxSigm<false>,double>(&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_ad0,"avx fast exact sigmoid","");
    BenchmarkFunc<TAvxSigm<true>,double>(&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_ad0,"dispatched fast sigmoid","");
    BenchmarkFunc<TDispatchedAvx2Sigm<false>,double>
              (&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    if (NFastOps::HaveAvx2()::haveAVX2 == '\0') {
      RunBenchmark<double>();
    }
    if (NFastOps::HaveAvx2()::haveAVX2 != '\x01') goto LAB_0010e830;
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"avx2 fast sigmoid","");
    BenchmarkFunc<TAvx2Sigm<false>,double>(&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_ad0,"avx2 fast exact sigmoid","");
    BenchmarkFunc<TAvx2Sigm<true>,double>(&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
  }
  else {
    if (local_a78 != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"!(isExp || isLog || isSigm || isTanh)");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    paVar1 = &local_ad0.field_2;
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"slow tanh","");
    BenchmarkFunc<TSlowTanh,double>(&local_a90,&local_aa8,local_ab0,1,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"plain fast tanh","");
    auVar18._8_4_ = uVar22;
    auVar18._0_8_ = sVar12;
    auVar18._12_4_ = 0x45300000;
    dVar16 = round(((auVar18._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,uVar17) - 4503599627370496.0)) * 0.5);
    BenchmarkFunc<TPlainTanh,double>(&local_a90,&local_aa8,local_ab0,(long)(int)dVar16,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"avx fast tanh","");
    BenchmarkFunc<TAvxTanh<false>,double>(&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"avx fast exact tanh","");
    BenchmarkFunc<TAvxTanh<true>,double>(&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_ad0,"dispatched fast sigmoid","");
    BenchmarkFunc<TDispatchedAvx2Tanh<false>,double>
              (&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    if (NFastOps::HaveAvx2()::haveAVX2 == '\0') {
      RunBenchmark<double>();
    }
    if (NFastOps::HaveAvx2()::haveAVX2 != '\x01') goto LAB_0010e830;
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"avx2 fast tanh","");
    BenchmarkFunc<TAvx2Tanh<false>,double>(&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ad0._M_dataplus._M_p != paVar1) {
      operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
    }
    local_ad0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"avx2 fast exact tanh","");
    BenchmarkFunc<TAvx2Tanh<true>,double>(&local_a90,&local_aa8,local_ab0,sVar12,&local_ad0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
    operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
  }
LAB_0010e830:
  if (local_aa8.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_aa8.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_aa8.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_aa8.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a90.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a90.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a90.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a90.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~vector(&local_a28);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~vector(&local_a10);
  if (local_a48[0] != local_a38) {
    operator_delete(local_a48[0],local_a38[0] + 1);
  }
  return;
}

Assistant:

void RunBenchmark(const TBenchmarkOpts& opts) {
    std::string func = opts.Func;
    size_t nVectors = opts.NVectors;
    size_t nIter = opts.NIter;
    size_t vecSize = opts.VecSize;
    size_t alignment = opts.Alignment;

    bool isExp = func == "exp";
    bool isLog = func == "log";
    bool isSigm = func == "sigm";
    bool isTanh = func == "tanh";
    if (!(isExp || isLog || isSigm || isTanh)) {
        std::cerr << "requirement isExp || isLog || isSigm || isTanh failed" << std::endl;
        exit(1);
    }

    std::cerr << "Preparing data. Vector size: " << vecSize << "\tnumber of vectors: " << nVectors << "\tnumber of tries: " << nIter << std::endl;
    std::mt19937_64 rng(15);
    std::uniform_real_distribution<> dis(0, 1.0);
    std::vector<std::vector<char>> inData(nVectors);
    std::vector<std::vector<char>> outData(nVectors);

    if (alignment >= 32) {
        std::cerr << "requirement alignment < 32 failed" << std::endl;
        exit(1);
    }
    if (alignment % sizeof(T) != 0) {
        std::cerr << "requirement on natural alignment failed: alignment should be multiple of " << sizeof(T) << std::endl;
        exit(1);
    }

    std::vector<T*> inVectors(nVectors);
    std::vector<T*> outVectors(nVectors);
    for (size_t i = 0; i < nVectors; ++i) {
        inData[i].resize(vecSize * sizeof(T) + 32);
        outData[i].resize(vecSize * sizeof(T) + 32);
        char* inV = inData[i].data();
        size_t cnt = 0;
        while ((size_t)inV % 32 != alignment) {
            ++inV;
        }
        cnt = 0;
        char* outV = outData[i].data();
        while ((size_t)outV % 32 != alignment) {
            ++outV;
        }

        inVectors[i] = (T*)inV;
        outVectors[i] = (T*)outV;
        for (size_t j = 0; j < vecSize; ++j) {
            auto& val = ((T*)inV)[j];
            val = 100 * dis(rng) - 50;
            if (isLog) {
                val = exp(val);
            } else if (isTanh || isSigm) {
                val /= 10;
            }
        }
    }

    std::cerr << "Running" << std::endl;
    if (isExp) {
        // too slow, just one iteration
        BenchmarkFunc<TSlowExp>(inVectors, outVectors, vecSize, 1, "slow exp");

        // slow, half iterations
        BenchmarkFunc<TPlainExp>(inVectors, outVectors, vecSize, int(round(nIter / 2.0)), "plain fast exp");

        if (vecSize % 4 == 0 && (alignment == 0 || alignment == 16)) {
            BenchmarkFunc<TFmathExp>(inVectors, outVectors, vecSize, nIter, "fmath exp");
        }
        BenchmarkFunc<TAvxExp<false>>(inVectors, outVectors, vecSize, nIter, "avx fast exp");
        BenchmarkFunc<TAvxExp<true>>(inVectors, outVectors, vecSize, nIter, "avx fast exact exp");
        BenchmarkFunc<TDispatchedAvx2Exp<false>>(
            inVectors, outVectors, vecSize, nIter, "dispatched fast exp");
        if (NFastOps::HaveAvx2()) {
            BenchmarkFunc<TAvx2Exp<false>>(inVectors, outVectors, vecSize, nIter, "avx2 fast exp");
            BenchmarkFunc<TAvx2Exp<true>>(inVectors, outVectors, vecSize, nIter, "avx2 fast exact exp");
        }
    } else if (isLog) {
        // too slow, just one iteration
        BenchmarkFunc<TSlowLog>(inVectors, outVectors, vecSize, 1, "slow log");

        // slow, half iterations
        BenchmarkFunc<TPlainLog>(inVectors, outVectors, vecSize, int(round(nIter / 2.0)), "plain fast log");

        if (vecSize % 4 == 0) {
            BenchmarkFunc<TFmathLog>(inVectors, outVectors, vecSize, nIter, "fmath log");
        }
        BenchmarkFunc<TAvxLog<false>>(inVectors, outVectors, vecSize, nIter, "avx fast log");
        BenchmarkFunc<TDispatchedAvx2Log<false>>(
            inVectors, outVectors, vecSize, nIter, "dispatched fast log");
        BenchmarkFunc<TAvxLog<true>>(inVectors, outVectors, vecSize, nIter, "avx fast exact log");
        if (NFastOps::HaveAvx2()) {
            BenchmarkFunc<TAvx2Log<false>>(inVectors, outVectors, vecSize, nIter, "avx2 fast log");
            BenchmarkFunc<TAvx2Log<true>>(inVectors, outVectors, vecSize, nIter, "avx2 fast exact log");
        }
    } else if (isSigm) {
        // too slow, just one iteration
        BenchmarkFunc<TSlowSigm>(inVectors, outVectors, vecSize, 1, "slow sigmoid");

        // slow, half iterations
        BenchmarkFunc<TPlainSigm>(inVectors, outVectors, vecSize, int(round(nIter / 2.0)), "plain fast sigmoid");

        BenchmarkFunc<TAvxSigm<false>>(inVectors, outVectors, vecSize, nIter, "avx fast sigmoid");
        BenchmarkFunc<TAvxSigm<true>>(inVectors, outVectors, vecSize, nIter, "avx fast exact sigmoid");
        BenchmarkFunc<TDispatchedAvx2Sigm<false>>(
            inVectors, outVectors, vecSize, nIter, "dispatched fast sigmoid");
        if (NFastOps::HaveAvx2()) {
            BenchmarkFunc<TAvx2Sigm<false>>(inVectors, outVectors, vecSize, nIter, "avx2 fast sigmoid");
            BenchmarkFunc<TAvx2Sigm<true>>(inVectors, outVectors, vecSize, nIter, "avx2 fast exact sigmoid");
        }
    } else if (isTanh) {
        // too slow, just one iteration
        BenchmarkFunc<TSlowTanh>(inVectors, outVectors, vecSize, 1, "slow tanh");

        // slow, half iterations
        BenchmarkFunc<TPlainTanh>(inVectors, outVectors, vecSize, int(round(nIter / 2.0)), "plain fast tanh");

        BenchmarkFunc<TAvxTanh<false>>(inVectors, outVectors, vecSize, nIter, "avx fast tanh");
        BenchmarkFunc<TAvxTanh<true>>(inVectors, outVectors, vecSize, nIter, "avx fast exact tanh");
        BenchmarkFunc<TDispatchedAvx2Tanh<false>>(
            inVectors, outVectors, vecSize, nIter, "dispatched fast sigmoid");
        if (NFastOps::HaveAvx2()) {
            BenchmarkFunc<TAvx2Tanh<false>>(inVectors, outVectors, vecSize, nIter, "avx2 fast tanh");
            BenchmarkFunc<TAvx2Tanh<true>>(inVectors, outVectors, vecSize, nIter, "avx2 fast exact tanh");
        }
    } else {
        throw std::runtime_error("!(isExp || isLog || isSigm || isTanh)");
    }
}